

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ArrayPtr<const_kj::CidrRange> kj::_::reservedCidrs(void)

{
  int iVar1;
  size_t size;
  StringPtr SVar2;
  ArrayPtr<const_kj::CidrRange> AVar3;
  
  if (reservedCidrs()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&reservedCidrs()::result);
    if (iVar1 != 0) {
      SVar2 = operator____kj("192.0.0.0/24",0xc);
      CidrRange::CidrRange((CidrRange *)reservedCidrs()::result,SVar2);
      SVar2 = operator____kj("224.0.0.0/4",0xb);
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x18),SVar2);
      SVar2 = operator____kj("240.0.0.0/4",0xb);
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x30),SVar2);
      SVar2 = operator____kj("255.255.255.255/32",0x12);
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x48),SVar2);
      SVar2 = operator____kj("2001::/23",9);
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x60),SVar2);
      SVar2 = operator____kj("ff00::/8",8);
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x78),SVar2);
      __cxa_guard_release(&reservedCidrs()::result);
    }
  }
  size = size<kj::CidrRange_const,6ul>(reservedCidrs()::result);
  AVar3 = arrayPtr<kj::CidrRange_const>((CidrRange *)reservedCidrs()::result,size);
  return AVar3;
}

Assistant:

ArrayPtr<const CidrRange> reservedCidrs() {
  // Address ranges reserved by RFCs for specific alternative protocols. These are not considered
  // part of "public", "private", "network", nor "local". But, we will allow apps to explicitly
  // allowlist CIDRs in this range if they really want, because some people actually use these
  // ranges as if they were private ranges.

  static const CidrRange result[] = {
    "192.0.0.0/24"_kj,          // RFC6890 reserved for special protocols
    "224.0.0.0/4"_kj,           // RFC1112 multicast
    "240.0.0.0/4"_kj,           // RFC1112 multicast / reserved for future use
    "255.255.255.255/32"_kj,    // RFC0919 broadcast address

    "2001::/23"_kj,             // RFC2928 reserved for special protocols
    "ff00::/8"_kj,              // RFC4291 multicast
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}